

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O1

void Omega_h::map_into<long>(Read<long> *a_data,Graph *a2b,Write<long> *b_data,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  Read<long> ab_data;
  LOs local_88;
  Read<signed_char> local_78;
  Write<signed_char> local_68;
  LOs local_58;
  Read<signed_char> local_48;
  Alloc *local_38;
  void *local_30;
  
  local_48.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
  local_58.write_.shared_alloc_.alloc = (a2b->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = (a2b->a2ab).write_.shared_alloc_.direct_ptr;
  expand<long>((Omega_h *)&local_38,&local_48,&local_58,width);
  pAVar2 = local_58.write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_78.write_.shared_alloc_.alloc = local_38;
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc = (Alloc *)(local_38->size * 8 + 1);
    }
    else {
      local_38->use_count = local_38->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.direct_ptr = local_30;
  local_88.write_.shared_alloc_.alloc = (a2b->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.write_.shared_alloc_.alloc)->use_count =
           (local_88.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = (a2b->ab2b).write_.shared_alloc_.direct_ptr;
  local_68.shared_alloc_.alloc = (b_data->shared_alloc_).alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.shared_alloc_.direct_ptr = (b_data->shared_alloc_).direct_ptr;
  map_into<long>(&local_78,&local_88,&local_68,width);
  pAVar2 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
    piVar1 = &local_38->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38);
      operator_delete(local_38,0x48);
    }
  }
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}